

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  coeff_buf *pcVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  uint8 uVar7;
  uint8 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  pcVar4 = pD->m_dc_coeffs[component_id];
  puVar5 = pcVar4->pData;
  iVar1 = pcVar4->block_size;
  iVar2 = pcVar4->block_num_x;
  uVar9 = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]]);
  if (uVar9 == 0) {
    uVar11 = 0;
    goto LAB_001230b3;
  }
  uVar10 = pD->m_bit_buf;
  uVar11 = uVar10 >> (-(byte)uVar9 & 0x1f);
  iVar3 = pD->m_bits_left;
  pD->m_bits_left = iVar3 - uVar9;
  if (iVar3 - uVar9 == 0 || iVar3 < (int)uVar9) {
    uVar10 = uVar10 << ((byte)iVar3 & 0x1f);
    pD->m_bit_buf = uVar10;
    if (pD->m_in_buf_left < 2) {
LAB_0012304f:
      uVar7 = get_octet(pD);
      uVar8 = get_octet(pD);
      pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar7,uVar8);
    }
    else {
      puVar6 = pD->m_pIn_buf_ofs;
      if ((*puVar6 == 0xff) || (puVar6[1] == 0xff)) goto LAB_0012304f;
      pD->m_bit_buf = CONCAT11(*puVar6,puVar6[1]) | uVar10;
      pD->m_in_buf_left = pD->m_in_buf_left + -2;
      pD->m_pIn_buf_ofs = puVar6 + 2;
    }
    pD->m_bit_buf = pD->m_bit_buf << (-(char)pD->m_bits_left & 0x1fU);
    pD->m_bits_left = pD->m_bits_left + 0x10;
  }
  else {
    pD->m_bit_buf = uVar10 << ((byte)uVar9 & 0x1f);
  }
  if ((int)uVar11 < *(int *)(s_extend_test + (ulong)(uVar9 & 0xf) * 4)) {
    uVar11 = uVar11 + *(int *)(s_extend_offset + (ulong)(uVar9 & 0xf) * 4);
  }
LAB_001230b3:
  uVar12 = uVar11 + pD->m_last_dc_val[component_id];
  pD->m_last_dc_val[component_id] = uVar12;
  *(short *)(puVar5 + (long)(block_y * iVar1 * iVar2) + (long)(block_x * iVar1)) =
       (short)(uVar12 << ((byte)pD->m_successive_low & 0x1f));
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int s, r;
  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

  if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0) {
    r = pD->get_bits_no_markers(s);
    s = JPGD_HUFF_EXTEND(r, s);
  }

  pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

  p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
}